

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void pipe2_pinger_new(int vectored_writes)

{
  int iVar1;
  uv_handle_type uVar2;
  uv_pipe_t *handle;
  uv_loop_t *puVar3;
  pinger_t *pinger_00;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  void *eval_b_6;
  void *eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  void *eval_b_3;
  void *eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t *ponger;
  pinger_t *pinger;
  uv_os_fd_t local_18;
  uv_os_fd_t fds [2];
  int vectored_writes_local;
  
  fds[0] = vectored_writes;
  iVar1 = uv_pipe((uv_os_fd_t *)((long)&pinger + 4),0x40,0x40);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x160,"uv_pipe(fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE)","==","0",(long)iVar1,"==",0);
    abort();
  }
  uVar2 = uv_guess_handle(pinger._4_4_);
  if ((ulong)uVar2 != 7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x161,"uv_guess_handle(fds[0])","==","UV_NAMED_PIPE",(ulong)uVar2,"==",7);
    abort();
  }
  uVar2 = uv_guess_handle(local_18);
  if ((ulong)uVar2 != 7) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x162,"uv_guess_handle(fds[1])","==","UV_NAMED_PIPE",(ulong)uVar2,"==",7);
    abort();
  }
  handle = (uv_pipe_t *)malloc(0xe8);
  if (handle == (uv_pipe_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x165,"ponger","!=","NULL",0,"!=",0);
    abort();
  }
  puVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar3,handle,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x166,"uv_pipe_init(uv_default_loop(), ponger, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_pipe_open(handle,pinger._4_4_);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x167,"uv_pipe_open(ponger, fds[0])","==","0",(long)iVar1,"==",0);
    abort();
  }
  pinger_00 = (pinger_t *)malloc(0x168);
  if (pinger_00 == (pinger_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x16a,"pinger","!=","NULL",0,"!=",0);
    abort();
  }
  pinger_00->vectored_writes = fds[0];
  pinger_00->state = 0;
  pinger_00->pongs = 0;
  pinger_00->pong = PING;
  puVar3 = uv_default_loop();
  iVar1 = uv_pipe_init(puVar3,&(pinger_00->stream).pipe,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x16f,"uv_pipe_init(uv_default_loop(), &pinger->stream.pipe, 0)","==","0",(long)iVar1,
            "==",0);
    abort();
  }
  iVar1 = uv_pipe_open(&(pinger_00->stream).pipe,local_18);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x170,"uv_pipe_open(&pinger->stream.pipe, fds[1])","==","0",(long)iVar1,"==",0);
    abort();
  }
  (pinger_00->stream).tcp.data = pinger_00;
  handle->data = pinger_00;
  pinger_write_ping(pinger_00);
  iVar1 = uv_read_start((uv_stream_t *)handle,alloc_cb,pinger_read_cb);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-ping-pong.c"
            ,0x176,"uv_read_start((uv_stream_t*) ponger, alloc_cb, pinger_read_cb)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void pipe2_pinger_new(int vectored_writes) {
  uv_os_fd_t fds[2];
  pinger_t* pinger;
  uv_pipe_t* ponger;

  /* Try to make a pipe and do NUM_PINGS pings. */
  ASSERT_OK(uv_pipe(fds, UV_NONBLOCK_PIPE, UV_NONBLOCK_PIPE));
  ASSERT_EQ(uv_guess_handle(fds[0]), UV_NAMED_PIPE);
  ASSERT_EQ(uv_guess_handle(fds[1]), UV_NAMED_PIPE);

  ponger = malloc(sizeof(*ponger));
  ASSERT_NOT_NULL(ponger);
  ASSERT_OK(uv_pipe_init(uv_default_loop(), ponger, 0));
  ASSERT_OK(uv_pipe_open(ponger, fds[0]));

  pinger = malloc(sizeof(*pinger));
  ASSERT_NOT_NULL(pinger);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;
  pinger->pong = PING;
  ASSERT_OK(uv_pipe_init(uv_default_loop(), &pinger->stream.pipe, 0));
  ASSERT_OK(uv_pipe_open(&pinger->stream.pipe, fds[1]));
  pinger->stream.pipe.data = pinger; /* record for close_cb */
  ponger->data = pinger; /* record for read_cb */

  pinger_write_ping(pinger);

  ASSERT_OK(uv_read_start((uv_stream_t*) ponger, alloc_cb, pinger_read_cb));
}